

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<>(CfdSourceLocation *source,CfdLogLevel lvl,char *fmt)

{
  char *pcVar1;
  CfdLogLevel level;
  CfdSourceLocation *location;
  bool bVar2;
  allocator local_41;
  string local_40;
  char *local_20;
  char *fmt_local;
  CfdSourceLocation *pCStack_10;
  CfdLogLevel lvl_local;
  CfdSourceLocation *source_local;
  
  local_20 = fmt;
  fmt_local._4_4_ = lvl;
  pCStack_10 = source;
  bVar2 = IsEnableLogLevel(lvl);
  location = pCStack_10;
  level = fmt_local._4_4_;
  pcVar1 = local_20;
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    WriteLog(location,level,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    cfd::core::logger::WriteLog(source, lvl, fmt);
  }
}